

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad.cpp
# Opt level: O1

ScalarFunction * duckdb::RpadFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe5c;
  FunctionNullHandling in_stack_fffffffffffffe68;
  bind_lambda_function_t in_stack_fffffffffffffe70;
  scalar_function_t local_188;
  LogicalType local_160;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_148;
  LogicalType local_130;
  LogicalType local_118 [3];
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(local_118,VARCHAR);
  LogicalType::LogicalType(local_118 + 1,INTEGER);
  LogicalType::LogicalType(local_118 + 2,VARCHAR);
  __l._M_len = 3;
  __l._M_array = local_118;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_148,__l,(allocator_type *)&stack0xfffffffffffffe77);
  LogicalType::LogicalType(&local_160,VARCHAR);
  local_188.super__Function_base._M_functor._8_8_ = 0;
  local_188.super__Function_base._M_functor._M_unused._M_object =
       PadFunction<duckdb::RightPadOperator>;
  local_188._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_188.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_130,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_130;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe54;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe5c;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_148,&local_160,&local_188,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffe68,in_stack_fffffffffffffe70);
  LogicalType::~LogicalType(&local_130);
  if (local_188.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_188.super__Function_base._M_manager)
              ((_Any_data *)&local_188,(_Any_data *)&local_188,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_160);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_148);
  lVar1 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_118[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction RpadFun::GetFunction() {
	ScalarFunction func({LogicalType::VARCHAR, LogicalType::INTEGER, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                    PadFunction<RightPadOperator>);
	BaseScalarFunction::SetReturnsError(func);
	return func;
}